

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp3_fast_iVar5(uint *pInOut,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  int iVar1;
  int local_34;
  int temp;
  int i;
  int *pDifStart_local;
  int jQ_local;
  int iQ_local;
  int finish_local;
  int start_local;
  uint *pInOut_local;
  
  local_34 = start + -1;
  while( true ) {
    if (local_34 < finish) {
      *pDifStart = 0;
      return 0;
    }
    iVar1 = CompareWords((ulong)pInOut[local_34 - iQ],(ulong)pInOut[local_34 - jQ]);
    if (iVar1 != 0) break;
    local_34 = local_34 + -4;
  }
  if (iVar1 == -1) {
    *pDifStart = local_34 + 1;
    return 0;
  }
  *pDifStart = local_34 + 1;
  return 1;
}

Assistant:

int minTemp3_fast_iVar5(unsigned* pInOut, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp3_fast_iVar5\n");

    for(i=start-1; i>=finish; i-=4) 
    {
        temp = CompareWords(pInOut[i-iQ],pInOut[i-jQ]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 1;
        }
    }
    *pDifStart=0;
    return 0;
}